

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

Tim_Man_t * Tim_ManDup(Tim_Man_t *p,int fUnitDelay)

{
  float fVar1;
  float fVar2;
  int iVar3;
  Tim_Man_t *p_00;
  Vec_Ptr_t *pVVar4;
  float *pfVar5;
  float *Entry;
  void *pvVar6;
  bool bVar7;
  float local_5c;
  int nOutputs;
  int nInputs;
  int k;
  int i;
  float *pDelayTableNew;
  float *pDelayTable;
  Tim_Obj_t *pObj;
  Tim_Box_t *pBox;
  Tim_Man_t *pNew;
  int fUnitDelay_local;
  Tim_Man_t *p_local;
  
  nInputs = 0;
  while( true ) {
    bVar7 = false;
    if (nInputs < p->nCis) {
      pDelayTable = (float *)(p->pCis + nInputs);
      bVar7 = (Tim_Obj_t *)pDelayTable != (Tim_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pDelayTable[1] = 0.0;
    nInputs = nInputs + 1;
  }
  nInputs = 0;
  while( true ) {
    bVar7 = false;
    if (nInputs < p->nCos) {
      pDelayTable = (float *)(p->pCos + nInputs);
      bVar7 = (Tim_Obj_t *)pDelayTable != (Tim_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pDelayTable[1] = 0.0;
    nInputs = nInputs + 1;
  }
  p_00 = Tim_ManStart(p->nCis,p->nCos);
  memcpy(p_00->pCis,p->pCis,(long)p->nCis * 0x18);
  memcpy(p_00->pCos,p->pCos,(long)p->nCos * 0x18);
  if (fUnitDelay != 0) {
    Tim_ManInitPiArrivalAll(p,0.0);
    Tim_ManInitPoRequiredAll(p,1e+09);
  }
  iVar3 = Tim_ManDelayTableNum(p);
  if (0 < iVar3) {
    iVar3 = Vec_PtrSize(p->vDelayTables);
    pVVar4 = Vec_PtrStart(iVar3);
    p_00->vDelayTables = pVVar4;
    for (nInputs = 0; iVar3 = Vec_PtrSize(p->vDelayTables), nInputs < iVar3; nInputs = nInputs + 1)
    {
      pfVar5 = (float *)Vec_PtrEntry(p->vDelayTables,nInputs);
      if (pfVar5 != (float *)0x0) {
        if (nInputs != (int)*pfVar5) {
          __assert_fail("i == (int)pDelayTable[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x7b,"Tim_Man_t *Tim_ManDup(Tim_Man_t *, int)");
        }
        fVar1 = pfVar5[1];
        fVar2 = pfVar5[2];
        Entry = (float *)malloc((long)((int)fVar1 * (int)fVar2 + 3) << 2);
        *Entry = (float)(int)*pfVar5;
        Entry[1] = (float)(int)pfVar5[1];
        Entry[2] = (float)(int)pfVar5[2];
        for (nOutputs = 0; nOutputs < (int)fVar1 * (int)fVar2; nOutputs = nOutputs + 1) {
          if ((pfVar5[nOutputs + 3] != -1e+09) || (NAN(pfVar5[nOutputs + 3]))) {
            if (fUnitDelay == 0) {
              local_5c = pfVar5[nOutputs + 3];
            }
            else {
              local_5c = (float)fUnitDelay;
            }
            Entry[nOutputs + 3] = local_5c;
          }
          else {
            Entry[nOutputs + 3] = -1e+09;
          }
        }
        pvVar6 = Vec_PtrEntry(p_00->vDelayTables,nInputs);
        if (pvVar6 != (void *)0x0) {
          __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timMan.c"
                        ,0x88,"Tim_Man_t *Tim_ManDup(Tim_Man_t *, int)");
        }
        Vec_PtrWriteEntry(p_00->vDelayTables,nInputs,Entry);
      }
    }
  }
  iVar3 = Tim_ManBoxNum(p);
  if (0 < iVar3) {
    iVar3 = Tim_ManBoxNum(p);
    pVVar4 = Vec_PtrAlloc(iVar3);
    p_00->vBoxes = pVVar4;
    for (nInputs = 0; iVar3 = Vec_PtrSize(p->vBoxes), nInputs < iVar3; nInputs = nInputs + 1) {
      pvVar6 = Vec_PtrEntry(p->vBoxes,nInputs);
      Tim_ManCreateBox(p_00,*(int *)((long)pvVar6 + 0x1c),*(int *)((long)pvVar6 + 8),
                       *(int *)((long)pvVar6 + (long)*(int *)((long)pvVar6 + 8) * 4 + 0x1c),
                       *(int *)((long)pvVar6 + 0xc),*(int *)((long)pvVar6 + 0x10),
                       *(int *)((long)pvVar6 + 0x18));
      Tim_ManBoxSetCopy(p_00,nInputs,*(int *)((long)pvVar6 + 0x14));
    }
  }
  return p_00;
}

Assistant:

Tim_Man_t * Tim_ManDup( Tim_Man_t * p, int fUnitDelay )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, nInputs, nOutputs;
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( p->nCis, p->nCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * p->nCis ); 
    memcpy( pNew->pCos, p->pCos, sizeof(Tim_Obj_t) * p->nCos ); 
    if ( fUnitDelay )
    {
        // discretize PI arrival times
//        Tim_ManForEachPi( pNew, pObj, k )
//          pObj->timeArr = (int)pObj->timeArr;
        // discretize PO required times
//        Tim_ManForEachPo( pNew, pObj, k )
//          pObj->timeReq = 1 + (int)pObj->timeReq;
        // clear PI arrival and PO required
        Tim_ManInitPiArrivalAll( p, 0.0 );
        Tim_ManInitPoRequiredAll( p, (float)TIM_ETERNITY );
    }
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = (int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                if ( pDelayTable[3+k] == -ABC_INFINITY )
                    pDelayTableNew[3+k] = -ABC_INFINITY;
                else
                    pDelayTableNew[3+k] = fUnitDelay ? (float)fUnitDelay : pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
//printf( "Finished duplicating delay table %d.\n", i );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Tim_ManForEachBox( p, pBox, i )
        {
           Tim_ManCreateBox( pNew, pBox->Inouts[0], pBox->nInputs, 
                pBox->Inouts[pBox->nInputs], pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
           Tim_ManBoxSetCopy( pNew, i, pBox->iCopy );
        }
    }
    return pNew;
}